

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParallelExecutionTests.cpp
# Opt level: O0

void __thiscall
agge::tests::ParallelExecutionTests::MultithreadedParallelObjectMakesCallInDifferentThreads
          (ParallelExecutionTests *this)

{
  reference ppVar1;
  ulong uVar2;
  size_type sVar3;
  allocator local_401;
  string local_400 [32];
  LocationInfo local_3e0;
  second_equal local_3b8;
  __normal_iterator<std::pair<unsigned_int,_unsigned_long>_*,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
  local_3b0;
  __normal_iterator<std::pair<unsigned_int,_unsigned_long>_*,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
  local_3a8;
  difference_type local_3a0;
  int local_398;
  allocator local_391;
  string local_390 [32];
  LocationInfo local_370;
  uint local_348;
  allocator local_341;
  count_t i_1;
  LocationInfo local_320;
  thread_id local_2f8;
  allocator local_2e9;
  string local_2e8 [32];
  LocationInfo local_2c8;
  size_type local_2a0;
  uint local_294;
  pair<unsigned_int,_unsigned_long> *local_290;
  __normal_iterator<std::pair<unsigned_int,_unsigned_long>_*,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
  local_288;
  allocator local_279;
  string local_278 [32];
  LocationInfo local_258;
  second_equal local_230;
  __normal_iterator<std::pair<unsigned_int,_unsigned_long>_*,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
  local_228;
  __normal_iterator<std::pair<unsigned_int,_unsigned_long>_*,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
  local_220;
  difference_type local_218;
  int local_210;
  allocator local_209;
  string local_208 [32];
  LocationInfo local_1e8;
  uint local_1c0;
  allocator local_1b9;
  count_t i;
  LocationInfo local_198;
  thread_id local_170;
  allocator local_161;
  string local_160 [32];
  LocationInfo local_140;
  size_type local_118;
  uint local_10c;
  pair<unsigned_int,_unsigned_long> *local_108;
  __normal_iterator<std::pair<unsigned_int,_unsigned_long>_*,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
  local_100;
  undefined1 local_f8 [8];
  thread_capture tc;
  mutex mtx;
  log_container log;
  undefined1 local_50 [8];
  parallel p7;
  parallel p3;
  ParallelExecutionTests *this_local;
  
  parallel::parallel((parallel *)&p7._threads_allocated,3);
  parallel::parallel((parallel *)local_50,7);
  std::
  vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
            *)(mtx._buffer + 0x5c));
  mutex::mutex((mutex *)((long)&tc._mutex + 4));
  thread_capture::thread_capture
            ((thread_capture *)local_f8,(log_container *)(mtx._buffer + 0x5c),
             (mutex *)((long)&tc._mutex + 4));
  parallel::call((parallel *)&p7._threads_allocated,(kernel_function *)local_f8);
  local_100._M_current =
       (pair<unsigned_int,_unsigned_long> *)
       std::
       vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
       ::begin((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                *)(mtx._buffer + 0x5c));
  local_108 = (pair<unsigned_int,_unsigned_long> *)
              std::
              vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
              ::end((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                     *)(mtx._buffer + 0x5c));
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_long>*,std::vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>>>
            (local_100,
             (__normal_iterator<std::pair<unsigned_int,_unsigned_long>_*,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
              )local_108);
  local_10c = 3;
  local_118 = std::
              vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
              ::size((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                      *)(mtx._buffer + 0x5c));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_160,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,&local_161);
  ut::LocationInfo::LocationInfo(&local_140,(string *)local_160,0x67);
  ut::are_equal<unsigned_int,unsigned_long>(&local_10c,&local_118,&local_140);
  ut::LocationInfo::~LocationInfo(&local_140);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  local_170 = this_thread_id();
  ppVar1 = std::
           vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
           ::operator[]((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                         *)(mtx._buffer + 0x5c),0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&i,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,&local_1b9);
  ut::LocationInfo::LocationInfo(&local_198,(string *)&i,0x68);
  ut::are_equal<unsigned_long,unsigned_long>(&local_170,&ppVar1->second,&local_198);
  ut::LocationInfo::~LocationInfo(&local_198);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  local_1c0 = 0;
  while( true ) {
    uVar2 = (ulong)local_1c0;
    sVar3 = std::
            vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
            ::size((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                    *)(mtx._buffer + 0x5c));
    if (sVar3 <= uVar2) break;
    ppVar1 = std::
             vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
             ::operator[]((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                           *)(mtx._buffer + 0x5c),(ulong)local_1c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
               ,&local_209);
    ut::LocationInfo::LocationInfo(&local_1e8,(string *)local_208,0x6b);
    ut::are_equal<unsigned_int,unsigned_int>(&local_1c0,&ppVar1->first,&local_1e8);
    ut::LocationInfo::~LocationInfo(&local_1e8);
    std::__cxx11::string::~string(local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    local_210 = 1;
    local_220._M_current =
         (pair<unsigned_int,_unsigned_long> *)
         std::
         vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
         ::begin((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                  *)(mtx._buffer + 0x5c));
    local_228._M_current =
         (pair<unsigned_int,_unsigned_long> *)
         std::
         vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
         ::end((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                *)(mtx._buffer + 0x5c));
    ppVar1 = std::
             vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
             ::operator[]((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                           *)(mtx._buffer + 0x5c),(ulong)local_1c0);
    second_equal::second_equal(&local_230,ppVar1->second);
    local_218 = std::
                count_if<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_long>*,std::vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>>,agge::tests::ParallelExecutionTests::second_equal>
                          (local_220,local_228,local_230);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
               ,&local_279);
    ut::LocationInfo::LocationInfo(&local_258,(string *)local_278,0x6c);
    ut::are_equal<int,long>(&local_210,&local_218,&local_258);
    ut::LocationInfo::~LocationInfo(&local_258);
    std::__cxx11::string::~string(local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    local_1c0 = local_1c0 + 1;
  }
  std::
  vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ::clear((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
           *)(mtx._buffer + 0x5c));
  parallel::call((parallel *)local_50,(kernel_function *)local_f8);
  local_288._M_current =
       (pair<unsigned_int,_unsigned_long> *)
       std::
       vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
       ::begin((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                *)(mtx._buffer + 0x5c));
  local_290 = (pair<unsigned_int,_unsigned_long> *)
              std::
              vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
              ::end((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                     *)(mtx._buffer + 0x5c));
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_long>*,std::vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>>>
            (local_288,
             (__normal_iterator<std::pair<unsigned_int,_unsigned_long>_*,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
              )local_290);
  local_294 = 7;
  local_2a0 = std::
              vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
              ::size((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                      *)(mtx._buffer + 0x5c));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2e8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,&local_2e9);
  ut::LocationInfo::LocationInfo(&local_2c8,(string *)local_2e8,0x78);
  ut::are_equal<unsigned_int,unsigned_long>(&local_294,&local_2a0,&local_2c8);
  ut::LocationInfo::~LocationInfo(&local_2c8);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  local_2f8 = this_thread_id();
  ppVar1 = std::
           vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
           ::operator[]((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                         *)(mtx._buffer + 0x5c),0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&i_1,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,&local_341);
  ut::LocationInfo::LocationInfo(&local_320,(string *)&i_1,0x79);
  ut::are_equal<unsigned_long,unsigned_long>(&local_2f8,&ppVar1->second,&local_320);
  ut::LocationInfo::~LocationInfo(&local_320);
  std::__cxx11::string::~string((string *)&i_1);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  local_348 = 0;
  while( true ) {
    uVar2 = (ulong)local_348;
    sVar3 = std::
            vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
            ::size((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                    *)(mtx._buffer + 0x5c));
    if (sVar3 <= uVar2) break;
    ppVar1 = std::
             vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
             ::operator[]((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                           *)(mtx._buffer + 0x5c),(ulong)local_348);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_390,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
               ,&local_391);
    ut::LocationInfo::LocationInfo(&local_370,(string *)local_390,0x7c);
    ut::are_equal<unsigned_int,unsigned_int>(&local_348,&ppVar1->first,&local_370);
    ut::LocationInfo::~LocationInfo(&local_370);
    std::__cxx11::string::~string(local_390);
    std::allocator<char>::~allocator((allocator<char> *)&local_391);
    local_398 = 1;
    local_3a8._M_current =
         (pair<unsigned_int,_unsigned_long> *)
         std::
         vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
         ::begin((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                  *)(mtx._buffer + 0x5c));
    local_3b0._M_current =
         (pair<unsigned_int,_unsigned_long> *)
         std::
         vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
         ::end((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                *)(mtx._buffer + 0x5c));
    ppVar1 = std::
             vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
             ::operator[]((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                           *)(mtx._buffer + 0x5c),(ulong)local_348);
    second_equal::second_equal(&local_3b8,ppVar1->second);
    local_3a0 = std::
                count_if<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_long>*,std::vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>>,agge::tests::ParallelExecutionTests::second_equal>
                          (local_3a8,local_3b0,local_3b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_400,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
               ,&local_401);
    ut::LocationInfo::LocationInfo(&local_3e0,(string *)local_400,0x7d);
    ut::are_equal<int,long>(&local_398,&local_3a0,&local_3e0);
    ut::LocationInfo::~LocationInfo(&local_3e0);
    std::__cxx11::string::~string(local_400);
    std::allocator<char>::~allocator((allocator<char> *)&local_401);
    local_348 = local_348 + 1;
  }
  mutex::~mutex((mutex *)((long)&tc._mutex + 4));
  std::
  vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ::~vector((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
             *)(mtx._buffer + 0x5c));
  parallel::~parallel((parallel *)local_50);
  parallel::~parallel((parallel *)&p7._threads_allocated);
  return;
}

Assistant:

test( MultithreadedParallelObjectMakesCallInDifferentThreads )
			{
				// INIT
				parallel p3(3), p7(7);
				thread_capture::log_container log;
				mutex mtx;
				thread_capture tc(log, mtx);

				// ACT
				p3.call(tc);

				// ASSERT
				sort(log.begin(), log.end());

				assert_equal(3u, log.size());
				assert_equal(this_thread_id(), log[0].second);
				for (count_t i = 0; i < log.size(); ++i)
				{
					assert_equal(i, log[i].first);
					assert_equal(1, count_if(log.begin(), log.end(), second_equal(log[i].second)));
				}

				// INIT
				log.clear();

				// ACT
				p7.call(tc);

				// ASSERT
				sort(log.begin(), log.end());

				assert_equal(7u, log.size());
				assert_equal(this_thread_id(), log[0].second);
				for (count_t i = 0; i < log.size(); ++i)
				{
					assert_equal(i, log[i].first);
					assert_equal(1, count_if(log.begin(), log.end(), second_equal(log[i].second)));
				}
			}